

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O1

raw_ostream * __thiscall llvm::raw_ostream::indent(raw_ostream *this,uint NumSpaces)

{
  raw_ostream *prVar1;
  size_t in_RCX;
  void *__buf;
  
  if (0x4f < NumSpaces) {
    do {
      __buf = (void *)0x4f;
      if (NumSpaces < 0x4f) {
        __buf = (void *)(ulong)NumSpaces;
      }
      write(this,0xe85320,__buf,in_RCX);
      NumSpaces = NumSpaces - (int)__buf;
    } while (NumSpaces != 0);
    return this;
  }
  prVar1 = (raw_ostream *)write(this,0xe85320,(void *)(ulong)NumSpaces,in_RCX);
  return prVar1;
}

Assistant:

raw_ostream &raw_ostream::indent(unsigned NumSpaces) {
  return write_padding<' '>(*this, NumSpaces);
}